

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O0

string * PrintStringToBIO_abi_cxx11_
                   (string *__return_storage_ptr__,ASN1_STRING *str,
                   _func_int_BIO_ptr_ASN1_STRING_ptr *print_func)

{
  uint8_t *puVar1;
  bool bVar2;
  int iVar3;
  BIO_METHOD *type;
  BIO *__p;
  pointer pbVar4;
  Message *message;
  allocator<char> local_61;
  undefined4 local_60;
  allocator<char> local_59;
  AssertHelper local_58;
  Message local_50 [3];
  unique_ptr<bio_st,_bssl::internal::Deleter> local_38;
  UniquePtr<BIO> bio;
  size_t len;
  uint8_t *data;
  _func_int_BIO_ptr_ASN1_STRING_ptr *print_func_local;
  ASN1_STRING *str_local;
  
  data = (uint8_t *)print_func;
  print_func_local = (_func_int_BIO_ptr_ASN1_STRING_ptr *)str;
  str_local = (ASN1_STRING *)__return_storage_ptr__;
  type = BIO_s_mem();
  __p = BIO_new(type);
  std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bio_st,bssl::internal::Deleter> *)&local_38,(pointer)__p);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_38);
  puVar1 = data;
  if (bVar2) {
    pbVar4 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&local_38);
    iVar3 = (*(code *)puVar1)(pbVar4,print_func_local);
    if (iVar3 != 0) {
      pbVar4 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&local_38);
      iVar3 = BIO_mem_contents(pbVar4,(uint8_t **)&len,(size_t *)&bio);
      if (iVar3 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<unsigned_char_const*,void>
                  ((string *)__return_storage_ptr__,(uchar *)len,
                   (uchar *)(len + (long)bio._M_t.
                                         super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t
                                         .super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                         super__Head_base<0UL,_bio_st_*,_false>._M_head_impl),
                   &local_61);
        std::allocator<char>::~allocator(&local_61);
        goto LAB_001e524c;
      }
    }
  }
  testing::Message::Message(local_50);
  message = testing::Message::operator<<(local_50,(char (*) [23])"Could not print to BIO");
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
             ,0x3d1,"Failed");
  testing::internal::AssertHelper::operator=(&local_58,message);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  testing::Message::~Message(local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_59);
  std::allocator<char>::~allocator(&local_59);
LAB_001e524c:
  local_60 = 1;
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string PrintStringToBIO(const ASN1_STRING *str,
                                    int (*print_func)(BIO *,
                                                      const ASN1_STRING *)) {
  const uint8_t *data;
  size_t len;
  bssl::UniquePtr<BIO> bio(BIO_new(BIO_s_mem()));
  if (!bio ||  //
      !print_func(bio.get(), str) ||
      !BIO_mem_contents(bio.get(), &data, &len)) {
    ADD_FAILURE() << "Could not print to BIO";
    return "";
  }
  return std::string(data, data + len);
}